

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::read_and_close_socket(Server *this,socket_t sock)

{
  bool bVar1;
  
  bVar1 = detail::
          read_and_close_socket<httplib::Server::read_and_close_socket(int)::_lambda(httplib::Stream&,bool,bool&)_1_>
                    (sock,this->keep_alive_max_count_,(anon_class_8_1_8991fb9c)this);
  return bVar1;
}

Assistant:

inline bool Server::read_and_close_socket(socket_t sock)
{
    return detail::read_and_close_socket(
        sock,
        keep_alive_max_count_,
        [this](Stream& strm, bool last_connection, bool& connection_close) {
            return process_request(strm, last_connection, connection_close);
        });
}